

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O1

OrigClOrdID * __thiscall
Application::queryOrigClOrdID(OrigClOrdID *__return_storage_ptr__,Application *this)

{
  ostream *poVar1;
  string value;
  undefined1 *local_30;
  long local_28;
  undefined1 local_20;
  undefined7 uStack_1f;
  
  local_28 = 0;
  local_20 = 0;
  local_30 = &local_20;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
  std::ostream::put('h');
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"OrigClOrdID: ",0xd);
  std::operator>>((istream *)&std::cin,(string *)&local_30);
  (__return_storage_ptr__->super_StringField).super_FieldBase._vptr_FieldBase =
       (_func_int **)&PTR__FieldBase_00161cc0;
  (__return_storage_ptr__->super_StringField).super_FieldBase.m_tag = 0x29;
  (__return_storage_ptr__->super_StringField).super_FieldBase.m_string._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->super_StringField).super_FieldBase.m_string.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(__return_storage_ptr__->super_StringField).super_FieldBase.m_string,
             local_30,local_30 + local_28);
  (__return_storage_ptr__->super_StringField).super_FieldBase.m_data._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->super_StringField).super_FieldBase.m_data.field_2;
  (__return_storage_ptr__->super_StringField).super_FieldBase.m_data._M_string_length = 0;
  (__return_storage_ptr__->super_StringField).super_FieldBase.m_data.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->super_StringField).super_FieldBase.m_metrics.m_length = 0;
  (__return_storage_ptr__->super_StringField).super_FieldBase.m_metrics.m_checksum = 0;
  (__return_storage_ptr__->super_StringField).super_FieldBase._vptr_FieldBase =
       (_func_int **)&PTR__FieldBase_001629c0;
  if (local_30 != &local_20) {
    operator_delete(local_30,CONCAT71(uStack_1f,local_20) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

FIX::OrigClOrdID Application::queryOrigClOrdID() {
  std::string value;
  std::cout << std::endl << "OrigClOrdID: ";
  std::cin >> value;
  return FIX::OrigClOrdID(value);
}